

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

_Bool ray_intersect_triangles_with_transform
                (vec3 ro,vec3 rd,vec3 *points,int num_points,mat4 transform,float *t,int *idx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  vec3 c;
  _Bool _Var5;
  vec3 vVar6;
  vec3 vVar7;
  vec3 vVar8;
  float local_104;
  undefined8 uStack_100;
  float t0;
  float local_f8;
  undefined8 local_f0;
  float local_e8;
  undefined8 local_e0;
  vec3 tp2;
  vec3 tp1;
  vec3 tp0;
  float local_6c;
  int i;
  float min_t;
  int *idx_local;
  float *t_local;
  int num_points_local;
  vec3 *points_local;
  vec3 rd_local;
  vec3 ro_local;
  
  local_6c = 3.4028235e+38;
  for (tp0.z = 0.0; (int)tp0.z < num_points; tp0.z = (float)((int)tp0.z + 3)) {
    uVar1 = points[(int)tp0.z].x;
    uVar3 = points[(int)tp0.z].y;
    vVar6.y = (float)uVar3;
    vVar6.x = (float)uVar1;
    vVar6.z = points[(int)tp0.z].z;
    vVar6 = vec3_apply_mat4(vVar6,1.0,transform);
    uVar2 = points[(int)tp0.z + 1].x;
    uVar4 = points[(int)tp0.z + 1].y;
    vVar7.y = (float)uVar4;
    vVar7.x = (float)uVar2;
    vVar7.z = points[(int)tp0.z + 1].z;
    vVar7 = vec3_apply_mat4(vVar7,1.0,transform);
    local_e8 = points[(int)tp0.z + 2].z;
    local_f0._0_4_ = points[(int)tp0.z + 2].x;
    local_f0._4_4_ = points[(int)tp0.z + 2].y;
    vVar8.z = local_e8;
    vVar8.x = (float)(undefined4)local_f0;
    vVar8.y = (float)local_f0._4_4_;
    unique0x10000a3f = vVar7;
    _uStack_100 = vec3_apply_mat4(vVar8,1.0,transform);
    tp2.x = local_f8;
    local_e0 = uStack_100;
    local_104 = 3.4028235e+38;
    vVar8 = vec3_add(ro,rd);
    c.z = tp2.x;
    c.x = (float)(undefined4)local_e0;
    c.y = (float)local_e0._4_4_;
    _Var5 = intersect_segment_triangle(ro,vVar8,vVar6,vVar7,c,&local_104);
    if ((_Var5) && (local_104 < local_6c)) {
      local_6c = local_104;
      *idx = (int)tp0.z / 3;
    }
  }
  *t = local_6c;
  return local_6c < 3.4028235e+38;
}

Assistant:

bool ray_intersect_triangles_with_transform(vec3 ro, vec3 rd, vec3 *points, int num_points, mat4 transform, float *t, int *idx) { 
    float min_t = FLT_MAX;  

    for (int i = 0; i < num_points; i += 3) {
        vec3 tp0 = vec3_apply_mat4(points[i + 0], 1, transform);
        vec3 tp1 = vec3_apply_mat4(points[i + 1], 1, transform);
        vec3 tp2 = vec3_apply_mat4(points[i + 2], 1, transform);

        float t0 = FLT_MAX;
        if (intersect_segment_triangle(ro, vec3_add(ro, rd), tp0, tp1, tp2, &t0)) {
            if (t0 < min_t) {
                min_t = t0;
                *idx = (i / 3);
            }
        }
    }

    *t = min_t;
    return min_t < FLT_MAX;
}